

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::UInt64Value::ByteSizeLong(UInt64Value *this)

{
  uint64_t uVar1;
  size_t sVar2;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  UInt64Value *this_;
  UInt64Value *this_local;
  
  sStack_20 = 0;
  uVar1 = _internal_value(this);
  if (uVar1 != 0) {
    uVar1 = _internal_value(this);
    sStack_20 = internal::WireFormatLite::UInt64SizePlusOne(uVar1);
  }
  sVar2 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_20,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t UInt64Value::ByteSizeLong() const {
          const UInt64Value& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(message_byte_size_start:google.protobuf.UInt64Value)
          ::size_t total_size = 0;

          ::uint32_t cached_has_bits = 0;
          // Prevent compiler warnings about cached_has_bits being unused
          (void)cached_has_bits;

           {
            // uint64 value = 1;
            if (this_._internal_value() != 0) {
              total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
                  this_._internal_value());
            }
          }
          return this_.MaybeComputeUnknownFieldsSize(total_size,
                                                     &this_._impl_._cached_size_);
        }